

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void swapBytes(uchar *var,int size)

{
  uchar uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  if (1 < size) {
    lVar4 = 0;
    lVar3 = (ulong)(uint)size - 2;
    do {
      uVar1 = var[lVar4];
      var[lVar4] = var[lVar3 + 1];
      var[lVar3 + 1] = uVar1;
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void swapBytes(unsigned char* var, int size)
{
  int i = 0;
  int j = size - 1;
  char c;

  while (i < j) {
    c = var[i]; var[i] = var[j]; var[j] = c;
    i++, j--;
  }
}